

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.h
# Opt level: O2

void __thiscall
ScriptCompression::Ser<SizeComputer>(ScriptCompression *this,SizeComputer *s,CScript *script)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  uint nSize;
  CompressedScript compr;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> local_58;
  uint local_4c;
  direct_or_indirect local_48;
  uint local_24;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = 0;
  local_48._24_8_ = 0;
  local_48.indirect_contents.indirect = (char *)0x0;
  local_48._8_8_ = 0;
  local_48.direct[0x20] = '\0';
  local_24 = 0;
  bVar1 = CompressScript(script,(CompressedScript *)&local_48.indirect_contents);
  if (bVar1) {
    bVar1 = local_24 < 0x22;
    uVar3 = local_24 - 0x22;
    uVar2 = local_24;
  }
  else {
    uVar2 = (script->super_CScriptBase)._size;
    local_4c = uVar2 - 0x1d;
    if (uVar2 < 0x1d) {
      local_4c = uVar2;
    }
    local_4c = local_4c + 6;
    local_58.m_object = &local_4c;
    Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&>::Serialize<SizeComputer>(&local_58,s);
    uVar2 = (script->super_CScriptBase)._size;
    bVar1 = uVar2 < 0x1d;
    uVar3 = uVar2 - 0x1d;
  }
  if (bVar1) {
    uVar3 = uVar2;
  }
  s->nSize = s->nSize + (ulong)uVar3;
  prevector<33U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<33U,_unsigned_char,_unsigned_int,_int> *)&local_48.indirect_contents);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream &s, const CScript& script) {
        CompressedScript compr;
        if (CompressScript(script, compr)) {
            s << Span{compr};
            return;
        }
        unsigned int nSize = script.size() + nSpecialScripts;
        s << VARINT(nSize);
        s << Span{script};
    }